

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

mbedtls_asn1_named_data *
mbedtls_asn1_store_named_data
          (mbedtls_asn1_named_data **head,char *oid,size_t oid_len,uchar *val,size_t val_len)

{
  uchar *puVar1;
  void *p;
  mbedtls_asn1_named_data *cur;
  size_t val_len_local;
  uchar *val_local;
  size_t oid_len_local;
  char *oid_local;
  mbedtls_asn1_named_data **head_local;
  
  p = mbedtls_asn1_find_named_data(*head,oid,oid_len);
  if ((mbedtls_asn1_named_data *)p == (mbedtls_asn1_named_data *)0x0) {
    p = calloc(1,0x40);
    if ((mbedtls_asn1_named_data *)p == (mbedtls_asn1_named_data *)0x0) {
      return (mbedtls_asn1_named_data *)0x0;
    }
    (((mbedtls_asn1_named_data *)p)->oid).len = oid_len;
    puVar1 = (uchar *)calloc(1,oid_len);
    (((mbedtls_asn1_named_data *)p)->oid).p = puVar1;
    if ((((mbedtls_asn1_named_data *)p)->oid).p == (uchar *)0x0) {
      free(p);
      return (mbedtls_asn1_named_data *)0x0;
    }
    memcpy((((mbedtls_asn1_named_data *)p)->oid).p,oid,oid_len);
    (((mbedtls_asn1_named_data *)p)->val).len = val_len;
    if (val_len != 0) {
      puVar1 = (uchar *)calloc(1,val_len);
      (((mbedtls_asn1_named_data *)p)->val).p = puVar1;
      if ((((mbedtls_asn1_named_data *)p)->val).p == (uchar *)0x0) {
        free((((mbedtls_asn1_named_data *)p)->oid).p);
        free(p);
        return (mbedtls_asn1_named_data *)0x0;
      }
    }
    ((mbedtls_asn1_named_data *)p)->next = *head;
    *head = (mbedtls_asn1_named_data *)p;
  }
  else if (val_len == 0) {
    free((((mbedtls_asn1_named_data *)p)->val).p);
    (((mbedtls_asn1_named_data *)p)->val).p = (uchar *)0x0;
  }
  else if ((((mbedtls_asn1_named_data *)p)->val).len != val_len) {
    puVar1 = (uchar *)calloc(1,val_len);
    if (puVar1 == (uchar *)0x0) {
      return (mbedtls_asn1_named_data *)0x0;
    }
    free((((mbedtls_asn1_named_data *)p)->val).p);
    (((mbedtls_asn1_named_data *)p)->val).p = puVar1;
    (((mbedtls_asn1_named_data *)p)->val).len = val_len;
  }
  if ((val != (uchar *)0x0) && (val_len != 0)) {
    memcpy(*(void **)((long)p + 0x28),val,val_len);
  }
  return (mbedtls_asn1_named_data *)p;
}

Assistant:

mbedtls_asn1_named_data *mbedtls_asn1_store_named_data(
    mbedtls_asn1_named_data **head,
    const char *oid, size_t oid_len,
    const unsigned char *val,
    size_t val_len)
{
    mbedtls_asn1_named_data *cur;

    if ((cur = asn1_find_named_data(*head, oid, oid_len)) == NULL) {
        // Add new entry if not present yet based on OID
        //
        cur = (mbedtls_asn1_named_data *) mbedtls_calloc(1,
                                                         sizeof(mbedtls_asn1_named_data));
        if (cur == NULL) {
            return NULL;
        }

        cur->oid.len = oid_len;
        cur->oid.p = mbedtls_calloc(1, oid_len);
        if (cur->oid.p == NULL) {
            mbedtls_free(cur);
            return NULL;
        }

        memcpy(cur->oid.p, oid, oid_len);

        cur->val.len = val_len;
        if (val_len != 0) {
            cur->val.p = mbedtls_calloc(1, val_len);
            if (cur->val.p == NULL) {
                mbedtls_free(cur->oid.p);
                mbedtls_free(cur);
                return NULL;
            }
        }

        cur->next = *head;
        *head = cur;
    } else if (val_len == 0) {
        mbedtls_free(cur->val.p);
        cur->val.p = NULL;
    } else if (cur->val.len != val_len) {
        /*
         * Enlarge existing value buffer if needed
         * Preserve old data until the allocation succeeded, to leave list in
         * a consistent state in case allocation fails.
         */
        void *p = mbedtls_calloc(1, val_len);
        if (p == NULL) {
            return NULL;
        }

        mbedtls_free(cur->val.p);
        cur->val.p = p;
        cur->val.len = val_len;
    }

    if (val != NULL && val_len != 0) {
        memcpy(cur->val.p, val, val_len);
    }

    return cur;
}